

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

IRType crec_ct2irt(CTState *cts,CType *ct)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IRType IVar4;
  ulong uVar5;
  
  uVar3 = ct->info;
  if ((uVar3 & 0xf0000000) == 0x50000000) {
    uVar5 = (ulong)((uVar3 & 0xffff) << 4);
    ct = (CType *)((long)&cts->tab->info + uVar5);
    uVar3 = *(uint *)((long)&cts->tab->info + uVar5);
  }
  if (uVar3 < 0x10000000) {
    uVar1 = ct->size;
    if ((uVar3 >> 0x1a & 1) != 0) {
      IVar4 = IRT_NUM;
      if (uVar1 != 8) {
        IVar4 = (uint)(uVar1 == 4) * 3 + IRT_CDATA;
      }
      return IVar4;
    }
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    if (uVar2 < 4) {
      return (uVar3 >> 0x17 & 1) + uVar2 * 2 + IRT_I8;
    }
  }
  else {
    if ((uVar3 & 0xf0000000) == 0x20000000) {
      return (uint)(ct->size == 8) * 4 + IRT_P32;
    }
    if ((uVar3 & 0xf4000000) == 0x34000000) {
      IVar4 = IRT_NUM;
      if (ct->size != 0x10) {
        IVar4 = (uint)(ct->size == 8) * 3 + IRT_CDATA;
      }
      return IVar4;
    }
  }
  return IRT_CDATA;
}

Assistant:

static IRType crec_ct2irt(CTState *cts, CType *ct)
{
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (LJ_LIKELY(ctype_isnum(ct->info))) {
    if ((ct->info & CTF_FP)) {
      if (ct->size == sizeof(double))
	return IRT_NUM;
      else if (ct->size == sizeof(float))
	return IRT_FLOAT;
    } else {
      uint32_t b = lj_fls(ct->size);
      if (b <= 3)
	return IRT_I8 + 2*b + ((ct->info & CTF_UNSIGNED) ? 1 : 0);
    }
  } else if (ctype_isptr(ct->info)) {
    return (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
  } else if (ctype_iscomplex(ct->info)) {
    if (ct->size == 2*sizeof(double))
      return IRT_NUM;
    else if (ct->size == 2*sizeof(float))
      return IRT_FLOAT;
  }
  return IRT_CDATA;
}